

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::showTearOffMenu(QMenu *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  QObject *ptr;
  undefined8 uVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x318));
  if (!bVar2) {
    ptr = (QObject *)operator_new(0x28);
    QTornOffMenu::QTornOffMenu((QTornOffMenu *)ptr,this);
    QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x318),ptr);
  }
  uVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
  QWidget::setGeometry
            (*(QWidget **)(lVar1 + 800),(pos->xp).m_i,(pos->yp).m_i,(int)uVar3,
             (int)((ulong)uVar3 >> 0x20));
  QWidget::show(*(QWidget **)(lVar1 + 800));
  return;
}

Assistant:

void QMenu::showTearOffMenu(const QPoint &pos)
{
    Q_D(QMenu);
    if (!d->tornPopup)
        d->tornPopup = new QTornOffMenu(this);
    const QSize &s = sizeHint();
    d->tornPopup->setGeometry(pos.x(), pos.y(), s.width(), s.height());
    d->tornPopup->show();
}